

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

InterpreterStackFrame *
Js::InterpreterStackFrame::CreateInterpreterStackFrameForGenerator
          (ScriptFunction *function,FunctionBody *executeFunction,JavascriptGenerator *generator,
          bool doProfile)

{
  Type *addr;
  ScriptContext *pSVar1;
  code *pcVar2;
  JavascriptGenerator *pJVar3;
  bool bVar4;
  BOOL BVar5;
  uint sourceContextId;
  RegSlot RVar6;
  undefined4 *puVar7;
  void *pvVar8;
  Recycler *pRVar9;
  ByteCodeReader *this;
  char *invalidStackVar;
  FunctionBody *pFVar10;
  BailInSymbol *pBVar11;
  undefined7 in_register_00000009;
  undefined1 local_d8 [8];
  Setup setup;
  Arguments generatorArgs;
  TrackAllocData data;
  JavascriptGenerator *local_50;
  JavascriptGenerator *generator_local;
  LoopHeader *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,doProfile);
  pSVar1 = (((((function->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
               super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  setup._56_8_ = (generator->args).Info;
  generatorArgs.Info = (Type)(generator->args).Values;
  local_50 = generator;
  Setup::Setup((Setup *)local_d8,function,(Arguments *)&setup.bailedOut,false,false,true);
  if (setup.localCount != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x74d,"(setup.GetStackAllocationVarCount() == 0)",
                                "setup.GetStackAllocationVarCount() == 0");
    if (!bVar4) goto LAB_00988324;
    *puVar7 = 0;
  }
  pvVar8 = FunctionProxy::GetAuxPtr((FunctionProxy *)executeFunction,LoopHeaderArray);
  generator_local = (JavascriptGenerator *)executeFunction;
  if (pvVar8 == (void *)0x0) {
    local_40 = (LoopHeader *)0x0;
  }
  else {
    local_40 = FunctionBody::GetLoopHeaderArrayPtr(executeFunction);
  }
  generatorArgs.Values = &void*::typeinfo;
  pRVar9 = Memory::Recycler::TrackAllocInfo
                     (pSVar1->recycler,(TrackAllocData *)&generatorArgs.Values);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00988324;
    *puVar7 = 0;
  }
  this = (ByteCodeReader *)
         Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                   (pRVar9,(ulong)(uint)setup.inSlotsCount * 8 + 8);
  if (this == (ByteCodeReader *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_00988324;
    *puVar7 = 0;
  }
  this->m_startLocation = (byte *)0x0;
  generatorArgs.Values = &void*::typeinfo;
  pRVar9 = Memory::Recycler::TrackAllocInfo
                     (pSVar1->recycler,(TrackAllocData *)&generatorArgs.Values);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00988324;
    *puVar7 = 0;
  }
  invalidStackVar =
       Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>(pRVar9,0x18);
  if (invalidStackVar == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_00988324;
    *puVar7 = 0;
  }
  pJVar3 = generator_local;
  invalidStackVar[0] = '\0';
  invalidStackVar[1] = '\0';
  invalidStackVar[2] = '\0';
  invalidStackVar[3] = '\0';
  invalidStackVar[4] = '\0';
  invalidStackVar[5] = '\0';
  invalidStackVar[6] = '\0';
  invalidStackVar[7] = '\0';
  invalidStackVar[0] = -2;
  invalidStackVar[1] = -2;
  invalidStackVar[2] = -2;
  invalidStackVar[3] = -2;
  invalidStackVar[4] = -2;
  invalidStackVar[5] = -2;
  invalidStackVar[6] = -2;
  invalidStackVar[7] = -2;
  invalidStackVar[8] = -2;
  invalidStackVar[9] = -2;
  invalidStackVar[10] = -2;
  invalidStackVar[0xb] = -2;
  invalidStackVar[0xc] = -2;
  invalidStackVar[0xd] = -2;
  invalidStackVar[0xe] = -2;
  invalidStackVar[0xf] = -2;
  Setup::InitializeAllocation
            ((Setup *)local_d8,(Var *)this,(Var *)0x0,
             (bool)((*(byte *)((long)&(generator_local->scriptFunction).ptr + 7) & 4) >> 2),
             local_34._0_1_,local_40,(DWORD_PTR)&local_50,invalidStackVar);
  ByteCodeReader::Create(this,(FunctionBody *)pJVar3,0);
  JavascriptGenerator::SetFrame
            (local_50,(InterpreterStackFrame *)this,(ulong)(uint)setup.inSlotsCount * 8);
  pFVar10 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar10);
  pFVar10 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  if ((pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_00988324;
    *puVar7 = 0;
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015cd718,BailInPhase,sourceContextId,
                            ((pFVar10->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo
                            .ptr)->functionId);
  pJVar3 = generator_local;
  if (bVar4) {
    pRVar9 = pSVar1->recycler;
    bVar4 = FunctionProxy::IsFunctionBody((FunctionProxy *)generator_local);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar4) goto LAB_00988324;
      *puVar7 = 0;
    }
    FunctionBody::GetLocalsCount((FunctionBody *)pJVar3);
    generatorArgs.Values = &JavascriptGenerator::BailInSymbol::typeinfo;
    pRVar9 = Memory::Recycler::TrackAllocInfo(pRVar9,(TrackAllocData *)&generatorArgs.Values);
    bVar4 = FunctionProxy::IsFunctionBody((FunctionProxy *)pJVar3);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar4) goto LAB_00988324;
      *puVar7 = 0;
    }
    RVar6 = FunctionBody::GetLocalsCount((FunctionBody *)pJVar3);
    if (RVar6 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar9,(TrackAllocData *)0x0);
      pBVar11 = (BailInSymbol *)&DAT_00000008;
    }
    else {
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00988324;
        *puVar7 = 0;
      }
      pBVar11 = (BailInSymbol *)
                Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                          (pRVar9,(ulong)RVar6 << 4);
      if (pBVar11 == (BailInSymbol *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_00988324:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
    pJVar3 = local_50;
    addr = &local_50->bailInSymbolsTraceArray;
    Memory::Recycler::WBSetBit((char *)addr);
    (pJVar3->bailInSymbolsTraceArray).ptr = pBVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  return (InterpreterStackFrame *)this;
}

Assistant:

InterpreterStackFrame* InterpreterStackFrame::CreateInterpreterStackFrameForGenerator(ScriptFunction* function, FunctionBody* executeFunction, JavascriptGenerator* generator, bool doProfile)
    {
        //
        // Allocate a new InterpreterStackFrame instance on the recycler heap.
        // It will live with the JavascriptGenerator object.
        //
        ScriptContext* functionScriptContext = function->GetScriptContext();
        Arguments generatorArgs = generator->GetArguments();
        InterpreterStackFrame::Setup setup(function, generatorArgs, false /* bailedOut */, false /* inlinee */, true /* isGeneratorFrame */);
        Assert(setup.GetStackAllocationVarCount() == 0);
        size_t varAllocCount = setup.GetAllocationVarCount();
        size_t varSizeInBytes = varAllocCount * sizeof(Var);
        DWORD_PTR stackAddr = reinterpret_cast<DWORD_PTR>(&generator); // use any stack address from this frame to ensure correct debugging functionality
        LoopHeader* loopHeaderArray = executeFunction->GetHasAllocatedLoopHeaders() ? executeFunction->GetLoopHeaderArrayPtr() : nullptr;

        Var* allocation = RecyclerNewPlus(functionScriptContext->GetRecycler(), varSizeInBytes, Var);
        AnalysisAssert(allocation);
        InterpreterStackFrame* newInstance;
#if DBG
        // Allocate invalidVar on GC instead of stack since this InterpreterStackFrame will out live the current real frame
        Js::RecyclableObject* invalidVar = (Js::RecyclableObject*)RecyclerNewPlusLeaf(functionScriptContext->GetRecycler(), sizeof(Js::RecyclableObject), Var);
        AnalysisAssert(invalidVar);
        memset(reinterpret_cast<void*>(invalidVar), 0xFE, sizeof(Js::RecyclableObject));
#endif

        newInstance = setup.InitializeAllocation(allocation, nullptr, executeFunction->GetHasImplicitArgIns(), doProfile, loopHeaderArray, stackAddr
#if DBG
            , invalidVar
#endif
            );

        newInstance->m_reader.Create(executeFunction);

        generator->SetFrame(newInstance, varSizeInBytes);

        // Moving this to when we create the generator instance in the first place would be nice.
        // But at that point the function might not have been parsed yet, so we don't have the locals count.
        // We are also allocating more space than we actually need because we shouldn't need to
        // reload all the symbols when bailing in.
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (PHASE_TRACE(Js::Phase::BailInPhase, function->GetFunctionBody()))
        {
            generator->bailInSymbolsTraceArray = (Js::JavascriptGenerator::BailInSymbol*) RecyclerNewArrayLeafZ(
                functionScriptContext->GetRecycler(), Js::JavascriptGenerator::BailInSymbol, executeFunction->GetFunctionBody()->GetLocalsCount()
            );
        }
#endif

        return newInstance;
    }